

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataViewDefault.cpp
# Opt level: O2

StringList * __thiscall
Rml::DataViewCommon::GetVariableNameList_abi_cxx11_
          (StringList *__return_storage_ptr__,DataViewCommon *this)

{
  code *pcVar1;
  bool bVar2;
  DataExpression *this_00;
  
  this_00 = (this->expression)._M_t.
            super___uniq_ptr_impl<Rml::DataExpression,_std::default_delete<Rml::DataExpression>_>.
            _M_t.
            super__Tuple_impl<0UL,_Rml::DataExpression_*,_std::default_delete<Rml::DataExpression>_>
            .super__Head_base<0UL,_Rml::DataExpression_*,_false>._M_head_impl;
  if (this_00 == (DataExpression *)0x0) {
    bVar2 = Assert("RMLUI_ASSERT(expression)",
                   "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/DataViewDefault.cpp"
                   ,0x44);
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    this_00 = (this->expression)._M_t.
              super___uniq_ptr_impl<Rml::DataExpression,_std::default_delete<Rml::DataExpression>_>.
              _M_t.
              super__Tuple_impl<0UL,_Rml::DataExpression_*,_std::default_delete<Rml::DataExpression>_>
              .super__Head_base<0UL,_Rml::DataExpression_*,_false>._M_head_impl;
  }
  DataExpression::GetVariableNameList_abi_cxx11_(__return_storage_ptr__,this_00);
  return __return_storage_ptr__;
}

Assistant:

StringList DataViewCommon::GetVariableNameList() const
{
	RMLUI_ASSERT(expression);
	return expression->GetVariableNameList();
}